

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O1

void __thiscall bf_crc::print_settings(bf_crc *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  ostream *poVar5;
  char *pcVar6;
  ostream *poVar7;
  char *pcVar8;
  string local_50;
  
  poVar7 = (ostream *)&std::cout;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Brute Force CRC Settings",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------------",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CRC Width\t\t: ",0xd);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Truncated Polynomial\t",0x15);
  if (this->polynomial_ == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": 0x0 to 0x",0xb);
    *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
         8;
    poVar5 = (ostream *)
             std::ostream::operator<<(&std::cout,~(-1 << ((byte)this->crc_width_ & 0x1f)));
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": 0x",4);
    *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
         8;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  }
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Truncated Polynomial\t",0x15);
  uVar2 = this->polynomial_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": 0x",4);
  *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  if (uVar2 == 0) {
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," to 0x",6);
    *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  }
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  pp_Var3 = poVar5->_vptr_basic_ostream;
  p_Var4 = pp_Var3[-3];
  *(uint *)(&poVar5->field_0x18 + (long)p_Var4) =
       *(uint *)(&poVar5->field_0x18 + (long)p_Var4) & 0xffffffb5 | 2;
  std::ios::widen((char)pp_Var3[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (this->probe_initial_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Initial value\t\t: 0x0 to 0x",0x1a);
    *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
         8;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Initial value\t\t: 0x",0x13);
    *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
         8;
  }
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  pp_Var3 = poVar5->_vptr_basic_ostream;
  p_Var4 = pp_Var3[-3];
  *(uint *)(&poVar5->field_0x18 + (long)p_Var4) =
       *(uint *)(&poVar5->field_0x18 + (long)p_Var4) & 0xffffffb5 | 2;
  std::ios::widen((char)pp_Var3[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (this->probe_final_xor_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Final xor\t\t: 0x0 to 0x",0x16);
    *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
         8;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"final xor\t\t: 0x",0xf);
    *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
         8;
  }
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  pp_Var3 = poVar5->_vptr_basic_ostream;
  p_Var4 = pp_Var3[-3];
  *(uint *)(&poVar5->field_0x18 + (long)p_Var4) =
       *(uint *)(&poVar5->field_0x18 + (long)p_Var4) & 0xffffffb5 | 2;
  std::ios::widen((char)pp_Var3[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Probe reflect in\t: ",0x13);
  pcVar8 = "false";
  pcVar6 = "false";
  if ((ulong)this->probe_reflected_input_ != 0) {
    pcVar6 = "true";
  }
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,pcVar6,pcVar6 + ((ulong)this->probe_reflected_input_ ^ 5));
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Probe reflect out\t: ",0x14);
  if ((ulong)this->probe_reflected_output_ != 0) {
    pcVar8 = "true";
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,pcVar8,pcVar8 + ((ulong)this->probe_reflected_output_ ^ 5));
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar6 = "Feed type               : ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Feed type               : ",0x1a);
  feed_type_to_str_abi_cxx11_(&local_50,(bf_crc *)pcVar6,this->feed_type_);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Permutation count\t: ",0x14);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void bf_crc::print_settings(void)
{

  // Output Brute Force Settings
  std::cout << "Brute Force CRC Settings" << std::endl;
  std::cout << "------------------------" << std::endl;

  std::cout << "CRC Width		: " << crc_width_ << std::endl;

  std::cout << "Truncated Polynomial	";
  if (polynomial_ > 0)
    std::cout << ": 0x" << std::hex << polynomial_ << std::endl;
  else
    std::cout << ": 0x0 to 0x" << std::hex << MAX_VALUE(crc_width_) << std::endl;


  std::cout << "Truncated Polynomial	";
	if (polynomial_ > 0)
		std::cout << ": 0x" << std::hex << polynomial_ << std::dec << std::endl;
	else
		std::cout << ": 0x" << std::hex << polynomial_start_ << " to 0x" << std::hex << polynomial_end_ << std::dec << std::endl;

	if (probe_initial_)
		std::cout << "Initial value		: 0x0 to 0x" << std::hex << max_value(crc_width_) << std::dec << std::endl;
	else
		std::cout << "Initial value		: 0x" << std::hex << initial_ << std::dec << std::endl;

	if (probe_final_xor_)
		std::cout << "Final xor		: 0x0 to 0x" << std::hex << max_value(crc_width_) << std::dec << std::endl;
	else
		std::cout << "final xor		: 0x" <<std::hex << final_xor_ << std::dec << std::endl;

	std::cout << "Probe reflect in	: " << bool_to_str(probe_reflected_input_) << std::endl;
	std::cout << "Probe reflect out	: " << bool_to_str(probe_reflected_output_) << std::endl;
	std::cout << "Feed type               : " << feed_type_to_str(feed_type_) << std::endl;

	std::cout << "Permutation count	: " << test_vector_count_ << std::endl;
	std::cout << std::endl << std::flush;	
}